

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  value_type *ppcVar1;
  int iVar2;
  GLFWwindow *handle;
  int iVar3;
  int iVar4;
  char *pcVar5;
  EVP_PKEY_CTX *ctx;
  long lVar6;
  char **__x;
  
  iVar4 = 1;
  do {
    if (argc <= iVar4) {
      glfwInit();
      glfwWindowHint(0x22002,4);
      glfwWindowHint(0x22003,5);
      glfwWindowHint(0x22008,0x32001);
      glfwWindowHint(0x22007,1);
      fwrite("Loading {Window-Main}\n",0x16,1,_stdout);
      fflush(_stdout);
      handle = glfwCreateWindow(0x690,0x41a,"Hello MERL",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
      if (handle == (GLFWwindow *)0x0) {
        fwrite("=> Failure <=\n",0xe,1,_stdout);
        fflush(_stdout);
        glfwTerminate();
      }
      else {
        glfwMakeContextCurrent(handle);
        glfwSetKeyCallback(handle,keyboardCallback);
        glfwSetCursorPosCallback(handle,mouseMotionCallback);
        glfwSetMouseButtonCallback(handle,mouseButtonCallback);
        glfwSetScrollCallback(handle,mouseScrollCallback);
        fwrite("Loading {OpenGL}\n",0x11,1,_stdout);
        fflush(_stdout);
        iVar4 = gladLoadGLLoader(glfwGetProcAddress);
        if (iVar4 != 0) {
          fwrite("-- Begin -- Demo\n",0x11,1,_stdout);
          fflush(_stdout);
          ImGui::CreateContext((ImFontAtlas *)0x0);
          ImGui_ImplGlfwGL3_Init(handle,false,(char *)0x0);
          ctx = (EVP_PKEY_CTX *)0x0;
          ImGui::StyleColorsDark((ImGuiStyle *)0x0);
          init(ctx);
          while (iVar4 = glfwWindowShouldClose(handle), iVar4 == 0) {
            glfwPollEvents();
            (*glad_glClearColor)(0.8,0.8,0.8,1.0);
            (*glad_glClear)(0x4000);
            render();
            glfwSwapBuffers(handle);
          }
          release();
          ImGui_ImplGlfwGL3_Shutdown();
          ImGui::DestroyContext((ImGuiContext *)0x0);
          glfwTerminate();
          fwrite("-- End -- Demo\n",0xf,1,_stdout);
          fflush(_stdout);
          return 0;
        }
        fwrite("gladLoadGLLoader failed\n",0x18,1,_stdout);
        fflush(_stdout);
      }
      return -1;
    }
    lVar6 = (long)iVar4;
    pcVar5 = argv[lVar6];
    iVar2 = strcmp("--merl",pcVar5);
    if (iVar2 == 0) {
      iVar4 = iVar4 + 1;
      do {
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)&g_sphere.shading,
                   argv + lVar6 + 1);
        if (argc <= iVar4) break;
      } while (*argv[lVar6 + 1] != '-');
      fprintf(_stdout,"Note: number of MERL BRDFs set to %i\n",0);
LAB_0014c485:
      fflush(_stdout);
    }
    else {
      iVar2 = strcmp("--envmap",pcVar5);
      if (iVar2 == 0) {
        iVar2 = iVar4 + 2;
        if (iVar4 + 2 < argc) {
          iVar2 = argc;
        }
        __x = argv + lVar6 + 1;
        lVar6 = lVar6 + 2;
        iVar3 = iVar4 + 1;
        do {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                    (&g_sphere.shading.envmap.files,__x);
          iVar4 = iVar2;
          if (argc <= lVar6) break;
          ppcVar1 = __x + 1;
          __x = __x + 1;
          iVar4 = iVar3 + 1;
          lVar6 = lVar6 + 1;
          iVar3 = iVar4;
        } while (**ppcVar1 != '-');
        fprintf(_stdout,"Note: number of Envmaps set to %i\n",0);
        goto LAB_0014c485;
      }
      iVar2 = strcmp("--shader-dir",pcVar5);
      if (iVar2 == 0) {
        g_app.dir.shader = argv[lVar6 + 1];
        pcVar5 = "Note: shader dir set to %s\n";
LAB_0014c47e:
        iVar4 = iVar4 + 1;
        fprintf(_stdout,pcVar5);
        goto LAB_0014c485;
      }
      iVar2 = strcmp("--npf-data",pcVar5);
      if (iVar2 == 0) {
        g_sphere.shading.pathToUberData = argv[lVar6 + 1];
        pcVar5 = "Note: NPF data set to %s\n";
        goto LAB_0014c47e;
      }
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

int main(int argc, const char **argv)
{
    for (int i = 1; i < argc; ++i) {
        if (!strcmp("--merl", argv[i])) {
            int cnt = 0;

            ++i;
            do {
                g_sphere.shading.merl.files.push_back(argv[i]);
            } while ((cnt < argc-i) && strncmp("-", argv[i+cnt], 1));
            LOG("Note: number of MERL BRDFs set to %i\n", cnt);
        } else if (!strcmp("--envmap", argv[i])) {
            int cnt = 0;

            ++i;
            do {
                g_sphere.shading.envmap.files.push_back(argv[i]);
                ++i;
            } while ((cnt < argc-i) && strncmp("-", argv[i], 1));
            LOG("Note: number of Envmaps set to %i\n", cnt);
        } else if (!strcmp("--shader-dir", argv[i])) {
            g_app.dir.shader = argv[++i];
            LOG("Note: shader dir set to %s\n", g_app.dir.shader);
        } else if (!strcmp("--npf-data", argv[i])) {
            g_sphere.shading.pathToUberData = argv[++i];
            LOG("Note: NPF data set to %s\n", g_sphere.shading.pathToUberData);
        }
    }

    glfwInit();
    glfwWindowHint(GLFW_CONTEXT_VERSION_MAJOR, 4);
    glfwWindowHint(GLFW_CONTEXT_VERSION_MINOR, 5);
    glfwWindowHint(GLFW_OPENGL_PROFILE, GLFW_OPENGL_CORE_PROFILE);
    glfwWindowHint(GLFW_OPENGL_DEBUG_CONTEXT, GL_TRUE);

    // Create the Window
    LOG("Loading {Window-Main}\n");
    GLFWwindow* window = glfwCreateWindow(
                             VIEWER_DEFAULT_WIDTH,
                             VIEWER_DEFAULT_HEIGHT,
                             "Hello MERL", NULL, NULL
                             );
    if (window == NULL) {
        LOG("=> Failure <=\n");
        glfwTerminate();
        return -1;
    }
    glfwMakeContextCurrent(window);
    glfwSetKeyCallback(window, &keyboardCallback);
    glfwSetCursorPosCallback(window, &mouseMotionCallback);
    glfwSetMouseButtonCallback(window, &mouseButtonCallback);
    glfwSetScrollCallback(window, &mouseScrollCallback);

    // Load OpenGL functions
    LOG("Loading {OpenGL}\n");
    if (!gladLoadGLLoader((GLADloadproc)glfwGetProcAddress)) {
        LOG("gladLoadGLLoader failed\n");
        return -1;
    }

    LOG("-- Begin -- Demo\n");
    try {
        //log_debug_output();
        ImGui::CreateContext();
        ImGui_ImplGlfwGL3_Init(window, false);
        ImGui::StyleColorsDark();
        init();

        while (!glfwWindowShouldClose(window)) {
            glfwPollEvents();

            glClearColor(0.8, 0.8, 0.8, 1.0);
            glClear(GL_COLOR_BUFFER_BIT);

            render();

            glfwSwapBuffers(window);
        }

        release();
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
    } catch (std::exception& e) {
        LOG("%s", e.what());
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    } catch (...) {
        ImGui_ImplGlfwGL3_Shutdown();
        ImGui::DestroyContext();
        glfwTerminate();
        LOG("(!) Demo Killed (!)\n");

        return EXIT_FAILURE;
    }
    LOG("-- End -- Demo\n");


    return 0;
}